

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O2

void wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::doEndBlock
               (ParamLiveness *self,Expression **currp)

{
  _Rb_tree_header *__x;
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *this;
  _Base_ptr p_Var1;
  bool bVar2;
  Block *pBVar3;
  iterator iVar4;
  Name *in_RCX;
  char *__to;
  char *extraout_RDX;
  char *__to_00;
  char *extraout_RDX_00;
  _Base_ptr p_Var5;
  Name *__y;
  
  pBVar3 = Expression::cast<wasm::Block>(*currp);
  if ((pBVar3->name).super_IString.str._M_str != (char *)0x0) {
    __y = &pBVar3->name;
    __x = &(self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
           super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
           branches._M_t._M_impl.super__Rb_tree_header;
    iVar4 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
            ::_M_lower_bound((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
                              *)*(_Base_ptr *)
                                 ((long)&(self->
                                         super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                         ).
                                         super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                         .branches._M_t._M_impl.super__Rb_tree_header._M_header + 8)
                             ,(_Link_type)__x,(_Base_ptr)__y,in_RCX);
    if ((_Rb_tree_header *)iVar4._M_node != __x) {
      bVar2 = IString::operator<(&__y->super_IString,(IString *)(iVar4._M_node + 1));
      if ((!bVar2) && (iVar4._M_node[1]._M_right != iVar4._M_node[1]._M_left)) {
        this = (CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
               (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               currBasicBlock;
        startBasicBlock((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                         *)self);
        link(this,(char *)(self->
                          super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
                          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                          .currBasicBlock,__to);
        p_Var1 = iVar4._M_node[1]._M_right;
        __to_00 = extraout_RDX;
        for (p_Var5 = iVar4._M_node[1]._M_left; p_Var5 != p_Var1;
            p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
          link(*(CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> **)
                p_Var5,(char *)(self->
                               super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                               ).
                               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                               .currBasicBlock,__to_00);
          __to_00 = extraout_RDX_00;
        }
        std::
        map<wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
        ::erase(&(self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 branches,__y);
        return;
      }
    }
  }
  return;
}

Assistant:

static void doEndBlock(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Block>();
    if (!curr->name.is()) {
      return;
    }
    auto iter = self->branches.find(curr->name);
    if (iter == self->branches.end()) {
      return;
    }
    auto& origins = iter->second;
    if (origins.size() == 0) {
      return;
    }
    // we have branches to here, so we need a new block
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    self->link(last, self->currBasicBlock); // fallthrough
    // branches to the new one
    for (auto* origin : origins) {
      self->link(origin, self->currBasicBlock);
    }
    self->branches.erase(curr->name);
  }